

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion(TIntermediate *this,uchar u8,TSourceLoc *loc,bool literal)

{
  pointer pTVar1;
  TIntermConstantUnion *pTVar2;
  undefined7 in_register_00000031;
  TIntermediate *this_00;
  TConstUnionArray unionArray;
  
  TConstUnionArray::TConstUnionArray(&unionArray,1);
  pTVar1 = ((unionArray.unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pTVar1->field_0).iConst = (int)CONCAT71(in_register_00000031,u8);
  pTVar1->type = EbtUint;
  this_00 = (TIntermediate *)&stack0xffffffffffffff38;
  TType::TType((TType *)&stack0xffffffffffffff38,EbtUint8,EvqConst,1,0,0,false);
  pTVar2 = addConstantUnion(this_00,&unionArray,(TType *)&stack0xffffffffffffff38,loc,literal);
  return pTVar2;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(unsigned char u8, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setUConst(u8);

    return addConstantUnion(unionArray, TType(EbtUint8, EvqConst), loc, literal);
}